

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::TypedTimeSamples<tinyusdz::Extent>::update(TypedTimeSamples<tinyusdz::Extent> *this)

{
  iterator iVar1;
  iterator iVar2;
  TypedTimeSamples<tinyusdz::Extent> *this_local;
  
  iVar1 = std::
          vector<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
          ::begin(&this->_samples);
  iVar2 = std::
          vector<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
          ::end(&this->_samples);
  std::
  sort<__gnu_cxx::__normal_iterator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample*,std::vector<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>>>,tinyusdz::TypedTimeSamples<tinyusdz::Extent>::update()const::_lambda(tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample_const&,tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample_const&)_1_>
            (iVar1._M_current,iVar2._M_current);
  this->_dirty = false;
  return;
}

Assistant:

void update() const {
    std::sort(_samples.begin(), _samples.end(),
              [](const Sample &a, const Sample &b) { return a.t < b.t; });

    _dirty = false;

    return;
  }